

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-mon.c
# Opt level: O2

void project_monster_handler_LIGHT(project_monster_handler_context_t *context)

{
  bitflag *flags;
  wchar_t wVar1;
  monster_race *pmVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  
  if (context->seen == true) {
    flag_on_dbg(context->lore->flags,0xc,0x4c,"context->lore->flags","RF_HURT_LIGHT");
  }
  _Var3 = flag_has_dbg(context->mon->race->spell_flags,0xd,0xd,"context->mon->race->spell_flags",
                       "RSF_BR_LIGHT");
  if (_Var3) {
    if (context->seen == true) {
      flag_on_dbg(context->lore->spell_flags,0xd,0xd,"context->lore->spell_flags","RSF_BR_LIGHT");
    }
    context->hurt_msg = MON_MSG_RESIST;
    context->dam = context->dam << 1;
    uVar4 = Rand_div(6);
    context->dam = context->dam / (int)(uVar4 + 7);
  }
  else {
    _Var3 = flag_has_dbg(context->mon->race->flags,0xc,0x4c,"context->mon->race->flags",
                         "RF_HURT_LIGHT");
    if (_Var3) {
      context->hurt_msg = MON_MSG_CRINGE_LIGHT;
      context->die_msg = MON_MSG_SHRIVEL_LIGHT;
      context->dam = context->dam << 1;
    }
  }
  if ((((context->origin).what == SRC_PLAYER) &&
      (_Var3 = flag_has_dbg((player->state).pflags,10,0x4e,"player->state.pflags","(PF_HOLY_LIGHT)")
      , _Var3)) && (uVar4 = Rand_div(5), uVar4 == 0)) {
    pmVar2 = context->mon->race;
    flags = pmVar2->flags;
    _Var3 = flag_has_dbg(flags,0xc,0x49,"context->mon->race->flags","RF_UNDEAD");
    if (((!_Var3) &&
        (_Var3 = flag_has_dbg(context->mon->race->flags,0xc,0x4c,"context->mon->race->flags",
                              "RF_HURT_LIGHT"), !_Var3)) &&
       (_Var3 = flag_has_dbg(context->mon->race->flags,0xc,0x48,"context->mon->race->flags",
                             "RF_EVIL"), !_Var3)) {
      return;
    }
    wVar1 = pmVar2->level;
    _Var3 = flag_has_dbg(flags,0xc,1,"race->flags","RF_UNIQUE");
    iVar5 = 2;
    if (_Var3) {
      iVar5 = 0x14;
    }
    uVar4 = Rand_div((int)player->lev + 10);
    if (iVar5 + wVar1 <= (int)uVar4) {
      iVar5 = damroll(2,(int)player->lev);
      context->mon_timed[3] = iVar5 + L'\x01';
      context->hurt_msg = MON_MSG_DISMAY_LIGHT;
    }
  }
  return;
}

Assistant:

static void project_monster_handler_LIGHT(project_monster_handler_context_t *context)
{
	if (context->seen) rf_on(context->lore->flags, RF_HURT_LIGHT);

	if (rsf_has(context->mon->race->spell_flags, RSF_BR_LIGHT)) {
		/* Learn about breathers through resistance */
		if (context->seen) rsf_on(context->lore->spell_flags, RSF_BR_LIGHT);

		context->hurt_msg = MON_MSG_RESIST;
		context->dam *= 2;
		context->dam /= randint1(6) + 6;
	}
	else if (rf_has(context->mon->race->flags, RF_HURT_LIGHT)) {
		context->hurt_msg = MON_MSG_CRINGE_LIGHT;
		context->die_msg = MON_MSG_SHRIVEL_LIGHT;
		context->dam *= 2;
	}

	/* Holy Light gives a chance to scare targets */
	if ((context->origin.what == SRC_PLAYER) &&
		player_has(player, PF_HOLY_LIGHT) &&
		one_in_(5)) {
		struct monster_race *race = context->mon->race;
		if (rf_has(context->mon->race->flags, RF_UNDEAD) ||
			rf_has(context->mon->race->flags, RF_HURT_LIGHT) ||
			rf_has(context->mon->race->flags, RF_EVIL)) {
			int save = race->level + (rf_has(race->flags, RF_UNIQUE) ? 20 : 2);
			if (save < randint1(player->lev + 10)) {
				context->mon_timed[MON_TMD_FEAR] = damroll(2, player->lev) + 1;
				context->hurt_msg = MON_MSG_DISMAY_LIGHT;
			}
		}
	}
}